

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConcurrentPtrQueue.hpp
# Opt level: O0

bool __thiscall
sftm::CConcurrentPtrQueue<sftm::CAsyncTask>::Push
          (CConcurrentPtrQueue<sftm::CAsyncTask> *this,CAsyncTask *pItem)

{
  uint uVar1;
  bool bVar2;
  lock_guard<sftm::CSpinLock> local_28;
  lock_guard<sftm::CSpinLock> lock;
  CAsyncTask *pItem_local;
  CConcurrentPtrQueue<sftm::CAsyncTask> *this_local;
  
  lock._M_device = (mutex_type *)pItem;
  std::lock_guard<sftm::CSpinLock>::lock_guard(&local_28,&this->m_lock);
  bVar2 = this->m_nCount < 0x200;
  if (bVar2) {
    uVar1 = this->m_nCount;
    this->m_nCount = uVar1 + 1;
    this->m_pItems[uVar1] = (CAsyncTask *)lock._M_device;
  }
  std::lock_guard<sftm::CSpinLock>::~lock_guard(&local_28);
  return bVar2;
}

Assistant:

bool Push(T* pItem) noexcept
		{
			std::lock_guard<CSyncPrimitive> lock(m_lock);

			if (m_nCount >= QUEUE_PHYSICAL_SIZE)
				return false;

			m_pItems[m_nCount++] = pItem;

			return true;
		}